

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl,uint update_hs_digest)

{
  int iVar1;
  bool bVar2;
  bool local_25;
  int local_20;
  int dtls_have_buffered;
  int ret;
  uint update_hs_digest_local;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x101a,"=> read record");
  if (ssl->keep_current_message == 0) {
    do {
      iVar1 = ssl_consume_current_message(ssl);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = ssl_record_is_in_progress(ssl);
      if (iVar1 == 0) {
        bVar2 = false;
        if ((ssl->conf->transport == '\x01') &&
           (iVar1 = ssl_next_record_is_in_datagram(ssl), iVar1 == 0)) {
          iVar1 = ssl_load_buffered_message(ssl);
          bVar2 = iVar1 == 0;
        }
        if (bVar2) goto LAB_0026df9e;
        local_20 = ssl_get_next_record(ssl);
        if (local_20 != -0x6580) {
          if (local_20 != 0) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1039,"ssl_get_next_record",local_20);
            return local_20;
          }
          goto LAB_0026df9e;
        }
      }
      else {
LAB_0026df9e:
        local_20 = mbedtls_ssl_handle_message_type(ssl);
        if (local_20 == -0x6480) {
          iVar1 = ssl_buffer_message(ssl);
          if (iVar1 != 0) {
            return iVar1;
          }
          local_20 = -0x6580;
        }
      }
      local_25 = local_20 == -0x6680 || local_20 == -0x6580;
    } while (local_25);
    if (local_20 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1051,"mbedtls_ssl_handle_message_type",local_20);
      return local_20;
    }
    if (((ssl->in_msgtype == 0x16) && (update_hs_digest == 1)) &&
       (iVar1 = mbedtls_ssl_update_handshake_status(ssl), iVar1 != 0)) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1059,"mbedtls_ssl_update_handshake_status",iVar1);
      return iVar1;
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x105e,"reuse previously read message");
    ssl->keep_current_message = 0;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x1062,"<= read record");
  return 0;
}

Assistant:

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl,
                            unsigned update_hs_digest)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> read record"));

    if (ssl->keep_current_message == 0) {
        do {

            ret = ssl_consume_current_message(ssl);
            if (ret != 0) {
                return ret;
            }

            if (ssl_record_is_in_progress(ssl) == 0) {
                int dtls_have_buffered = 0;
#if defined(MBEDTLS_SSL_PROTO_DTLS)

                /* We only check for buffered messages if the
                 * current datagram is fully consumed. */
                if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
                    ssl_next_record_is_in_datagram(ssl) == 0) {
                    if (ssl_load_buffered_message(ssl) == 0) {
                        dtls_have_buffered = 1;
                    }
                }

#endif /* MBEDTLS_SSL_PROTO_DTLS */
                if (dtls_have_buffered == 0) {
                    ret = ssl_get_next_record(ssl);
                    if (ret == MBEDTLS_ERR_SSL_CONTINUE_PROCESSING) {
                        continue;
                    }

                    if (ret != 0) {
                        MBEDTLS_SSL_DEBUG_RET(1, ("ssl_get_next_record"), ret);
                        return ret;
                    }
                }
            }

            ret = mbedtls_ssl_handle_message_type(ssl);

#if defined(MBEDTLS_SSL_PROTO_DTLS)
            if (ret == MBEDTLS_ERR_SSL_EARLY_MESSAGE) {
                /* Buffer future message */
                ret = ssl_buffer_message(ssl);
                if (ret != 0) {
                    return ret;
                }

                ret = MBEDTLS_ERR_SSL_CONTINUE_PROCESSING;
            }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        } while (MBEDTLS_ERR_SSL_NON_FATAL           == ret  ||
                 MBEDTLS_ERR_SSL_CONTINUE_PROCESSING == ret);

        if (0 != ret) {
            MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_handle_message_type"), ret);
            return ret;
        }

        if (ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
            update_hs_digest == 1) {
            ret = mbedtls_ssl_update_handshake_status(ssl);
            if (0 != ret) {
                MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_update_handshake_status"), ret);
                return ret;
            }
        }
    } else {
        MBEDTLS_SSL_DEBUG_MSG(2, ("reuse previously read message"));
        ssl->keep_current_message = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= read record"));

    return 0;
}